

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetools.cpp
# Opt level: O0

int32_t whichFileModTimeIsLater(char *file1,char *file2)

{
  int iVar1;
  double dVar2;
  double diff;
  time_t modtime2;
  time_t modtime1;
  stat stbuf2;
  stat stbuf1;
  int32_t result;
  char *file2_local;
  char *file1_local;
  
  iVar1 = stat(file1,(stat *)(stbuf2.__glibc_reserved + 2));
  if ((iVar1 == 0) && (iVar1 = stat(file2,(stat *)&modtime1), iVar1 == 0)) {
    dVar2 = difftime(stbuf1.st_atim.tv_nsec,stbuf2.st_atim.tv_nsec);
    if (0.0 <= dVar2) {
      stbuf1.__glibc_reserved[2]._5_3_ = 0;
      stbuf1.__glibc_reserved[2]._4_1_ = 0.0 < dVar2;
    }
    else {
      stbuf1.__glibc_reserved[2]._4_4_ = 2;
    }
  }
  else {
    fprintf(_stderr,"Unable to get stats from file: %s or %s\n",file1,file2);
    stbuf1.__glibc_reserved[2]._4_4_ = 0xffffffff;
  }
  return stbuf1.__glibc_reserved[2]._4_4_;
}

Assistant:

static int32_t whichFileModTimeIsLater(const char *file1, const char *file2) {
    int32_t result = 0;
    struct stat stbuf1, stbuf2;

    if (stat(file1, &stbuf1) == 0 && stat(file2, &stbuf2) == 0) {
        time_t modtime1, modtime2;
        double diff;

        modtime1 = stbuf1.st_mtime;
        modtime2 = stbuf2.st_mtime;

        diff = difftime(modtime1, modtime2);
        if (diff < 0.0) {
            result = 2;
        } else if (diff > 0.0) {
            result = 1;
        }

    } else {
        fprintf(stderr, "Unable to get stats from file: %s or %s\n", file1, file2);
        result = -1;
    }

    return result;
}